

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::Matchers::StdString::EndsWithMatcher::EndsWithMatcher
          (EndsWithMatcher *this,CasedString *comparator)

{
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"ends with",&local_39);
  StringMatcherBase::StringMatcherBase(&this->super_StringMatcherBase,&local_38,comparator);
  std::__cxx11::string::~string((string *)&local_38);
  (this->super_StringMatcherBase).
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)&PTR__StringMatcherBase_00197018;
  (this->super_StringMatcherBase).
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super_MatcherMethod<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._vptr_MatcherMethod = (_func_int **)&DAT_00197048;
  return;
}

Assistant:

EndsWithMatcher::EndsWithMatcher( CasedString const& comparator ) : StringMatcherBase( "ends with", comparator ) {}